

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddStartState::operator()
          (AddStartState *this,iterator_t *str,iterator_t *end)

{
  ostream *poVar1;
  undefined8 uVar2;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  stringstream ss_1;
  E e;
  Index sI;
  stringstream ss;
  string *in_stack_fffffffffffffc08;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffc10;
  value_type_conflict1 *in_stack_fffffffffffffc18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc20;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*(int *)(*in_RDI + 0x40) != 3) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,
                    "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"
                   );
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar1 = DPOMDPFormatParsing::operator<<
                       ((ostream *)in_stack_fffffffffffffc10,
                        (file_position *)in_stack_fffffffffffffc08);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)in_stack_fffffffffffffc10,(stringstream *)in_stack_fffffffffffffc08);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
  MultiAgentDecisionProcessDiscrete::GetStateIndexByName
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != STRING)
                {
                    std::stringstream ss; ss << "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"<<str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
                try
                {
                    Index sI = _m_po->GetDecPOMDPDiscrete()->GetStateIndexByName(
                            _m_po->_m_lp_string);
                    _m_po->_m_startStateListSI.push_back(sI);
                }
                catch(E e)
                {
                    std::stringstream ss; ss << e.SoftPrint() << "(at"<<
                        str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
            }